

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOutHelper
              (JavascriptCallStackLayout *layout,ScriptFunction **functionRef,Arguments *args,
              bool isInlinee,BailOutRecord *bailOutRecord,uint32 bailOutOffset,void *returnAddress,
              BailOutKind bailOutKind,Var *registerSaves,BailOutReturnValue *bailOutReturnValue,
              Var *pArgumentsObject,Var branchValue,void *argoutRestoreAddress)

{
  byte bVar1;
  byte bVar2;
  ScriptFunction *function_00;
  JavascriptFunction *pJVar3;
  code *pcVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  InterpreterStackFrame *pIVar7;
  ArenaAllocator *stackAllocation_00;
  bool bVar8;
  bool bVar9;
  ImplicitCallFlags flags;
  ArgSlot AVar10;
  uint32 uVar11;
  BailOutKind BVar12;
  uint uVar13;
  LocalFunctionId LVar14;
  int iVar15;
  RegSlot RVar16;
  RegSlot RVar17;
  RegSlot localRegisterID;
  FunctionBody *pFVar18;
  ScriptContext *this;
  ThreadContext *pTVar19;
  DebugManager *this_00;
  DebuggingFlags *this_01;
  FunctionBody *pFVar20;
  undefined4 *puVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar22;
  undefined4 extraout_var_02;
  char16 *pcVar23;
  Var pvVar24;
  long lVar25;
  ScriptFunction *pSVar26;
  ForInObjectEnumerator *pFVar27;
  ScriptContext *this_02;
  Var *ppvVar28;
  FrameDisplay *pFVar29;
  Var pvVar30;
  ScriptFunction *pSVar31;
  JavascriptGenerator *pJVar32;
  Type *__s;
  undefined1 auStack_3a8 [64];
  InterpreterStackFrame *local_368;
  bool local_359;
  InterpreterStackFrame *local_358;
  uint32 local_350;
  uint local_34c;
  uint local_348;
  uint local_344;
  undefined8 local_340;
  uint local_334;
  undefined8 local_330;
  char16 *local_328;
  uint32 local_320;
  uint local_31c;
  undefined8 local_318;
  char16 *local_310;
  uint local_304;
  undefined8 local_300;
  char16 *local_2f8;
  uint32 local_2f0;
  uint32 local_2ec;
  char16 *local_2e8;
  uint local_2dc;
  uint local_2d8;
  bool local_2d1;
  Var local_2d0;
  Var oldValue;
  DynamicProfileInfo *dynamicProfileInfo;
  undefined1 local_2b0 [8];
  PushPopFrameHelper pushPopFrameHelper;
  Var aReturn;
  ScriptFunction *currentFunctionObject;
  uint local_280;
  RegSlot reg;
  uint32 i_1;
  uint32 innerScopeCount;
  Var closure_1;
  Var closure;
  FrameDisplay *frameDisplay;
  uintptr_t scopeSlotsIndex;
  Var localClosure;
  uintptr_t frameDisplayIndex;
  FrameDisplay *localFrameDisplay;
  RegSlot paramClosureReg;
  RegSlot localClosureReg;
  RegSlot localFrameDisplayReg;
  RegSlot constantCount;
  RegSlot varCount;
  ThreadContext *threadContext;
  int forInEnumeratorArrayRestoreOffset;
  Var invalidStackVar;
  DWORD_PTR frameStackAddr;
  LoopHeader *loopHeaderArray;
  size_t stackVarSizeInBytes;
  ArenaAllocator *tmpAlloc;
  Var *stackAllocation;
  size_t varSizeInBytes;
  size_t stackVarAllocCount;
  size_t varAllocCount;
  Setup setup;
  JavascriptGenerator *generator;
  Var *allocation;
  InterpreterStackFrame *newInstance;
  bool fReleaseAlloc;
  Var boxedArg;
  Var arg;
  wchar local_158 [2];
  uint i;
  char16 debugStringBuffer [42];
  wchar local_f8 [4];
  char16 debugStringBuffer_1 [42];
  bool isSameFunction;
  bool needResetData;
  int byteCodeOffsetAfterEx;
  DebuggingFlags *debuggingFlags;
  DebugManager *debugManager;
  bool isInDebugMode;
  bool useStartCall;
  ScriptContext *functionScriptContext;
  FunctionBody *executeFunction;
  ScriptFunction *function;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  bool isInlinee_local;
  Arguments *args_local;
  ScriptFunction **functionRef_local;
  JavascriptCallStackLayout *layout_local;
  
  pJVar32 = (JavascriptGenerator *)auStack_3a8;
  __s = (Type *)auStack_3a8;
  function_00 = *functionRef;
  pFVar18 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
  this = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar18);
  debugManager._7_1_ = 1;
  pTVar19 = Js::ScriptContext::GetThreadContext(this);
  ThreadContext::ClearDisableImplicitFlags(pTVar19);
  bVar8 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar18);
  function._4_4_ = bailOutOffset;
  if (bVar8) {
    pTVar19 = Js::ScriptContext::GetThreadContext(this);
    this_00 = ThreadContext::GetDebugManager(pTVar19);
    this_01 = Js::DebugManager::GetDebuggingFlags(this_00);
    uVar11 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreException(this_01);
    BVar12 = IR::operator&(bailOutKind,BailOutIgnoreException);
    if ((BVar12 != BailOutInvalid) || (uVar11 != 0xffffffff)) {
      debugStringBuffer_1[0x29]._1_1_ = 1;
      uVar13 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01);
      local_2d1 = true;
      if (uVar13 != 0) {
        local_2d8 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01);
        pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
        uVar13 = Js::FunctionProxy::GetFunctionNumber((FunctionProxy *)pFVar20);
        local_2d1 = local_2d8 == uVar13;
      }
      debugStringBuffer_1[0x29]._0_1_ = local_2d1;
      if (local_2d1 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x5ab,"(isSameFunction)",
                           "Bailout due to ignore exception in different function, can\'t bail out cross functions!"
                          );
        if (!bVar9) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar21 = 0;
      }
      if (((byte)debugStringBuffer_1[0x29] & 1) != 0) {
        if ((uVar11 == 0xffffffff) &&
           (uVar13 = DebuggingFlags::GetFuncNumberAfterIgnoreException(this_01), uVar13 != 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar21 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x5af,
                             "(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber))"
                             ,
                             "!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber)"
                            );
          if (!bVar9) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar21 = 0;
        }
        if (uVar11 == 0xffffffff) {
          debugStringBuffer_1[0x29]._1_1_ = 0;
        }
        else {
          bVar9 = Js::StepController::IsActive(&this_00->stepController);
          if (bVar9) {
            Js::StepController::SetFrameAddr(&this_00->stepController,0);
          }
          if (bailOutOffset == uVar11) {
            BVar12 = IR::operator&(bailOutKind,BailOutIgnoreException);
            bVar9 = IR::operator!(BVar12);
            if (bVar9) goto LAB_0050527d;
          }
          else {
LAB_0050527d:
            local_2dc = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
            LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
            bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,local_2dc,LVar14);
            if (((bVar9) &&
                ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0)))) &&
               ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
                (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9))))
            {
              iVar15 = (*(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[7])();
              local_300 = CONCAT44(extraout_var,iVar15);
              local_2f8 = Js::FunctionProxy::GetDebugNumberSet
                                    ((FunctionProxy *)pFVar18,(wchar (*) [42])local_f8);
              local_2f0 = bailOutOffset;
              local_2ec = uVar11;
              local_2e8 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
              pcVar22 = GetBailOutKindName(BailOutIgnoreException);
              Output::Print(L"BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"
                            ,local_300,local_2f8,(ulong)local_2f0,(ulong)local_2ec,local_2e8,pcVar22
                           );
              if (bailOutKind != BailOutInvalid) {
                pcVar22 = GetBailOutKindName(bailOutKind);
                Output::Print(L" Kind: %S",pcVar22);
              }
              Output::Print(L"\n");
            }
            local_304 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
            LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
            bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,local_304,LVar14);
            if (((bVar9) &&
                ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0)))) &&
               ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
                (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9))))
            {
              iVar15 = (*(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[7])();
              local_318 = CONCAT44(extraout_var_00,iVar15);
              local_310 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
              pcVar22 = GetBailOutKindName(BailOutIgnoreException);
              Output::Print(L"BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"
                            ,local_318,local_310,pcVar22);
              if (bailOutKind != BailOutInvalid) {
                pcVar22 = GetBailOutKindName(bailOutKind);
                Output::Print(L" Kind: %S",pcVar22);
              }
              Output::Print(L"\n");
            }
          }
          debugManager._7_1_ = 0;
          function._4_4_ = uVar11;
        }
      }
      if ((debugStringBuffer_1[0x29]._1_1_ & 1) != 0) {
        DebuggingFlags::ResetByteCodeOffsetAndFuncAfterIgnoreException(this_01);
      }
    }
  }
  local_31c = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
  LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,local_31c,LVar14);
  if (((bVar9) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0))))
     && ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
         (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9)))) {
    iVar15 = (*(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    local_330 = CONCAT44(extraout_var_01,iVar15);
    local_328 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar18,(wchar (*) [42])local_158);
    local_320 = function._4_4_;
    pcVar23 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) offset: #%04x Opcode: %s",local_330,local_328,
                  (ulong)local_320,pcVar23);
    if (bailOutKind != BailOutInvalid) {
      pcVar22 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar22);
    }
    Output::Print(L"\n");
  }
  local_334 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
  LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,local_334,LVar14);
  if (((bVar9) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || ((DAT_01ec73ca & 1) != 0))))
     && ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
         (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9)))) {
    iVar15 = (*(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    local_340 = CONCAT44(extraout_var_02,iVar15);
    pcVar23 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Opcode: %s",local_340,pcVar23);
    if (bailOutKind != BailOutInvalid) {
      GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S");
    }
    Output::Print(L"\n");
  }
  if ((isInlinee) && (((ulong)args->Info & 0xffffff) != 0)) {
    for (arg._4_4_ = 0; arg._4_4_ < (SUB84(args->Info,0) & 0xffffff); arg._4_4_ = arg._4_4_ + 1) {
      pvVar30 = args->Values[arg._4_4_];
      if ((DAT_01ec73ca & 1) != 0) {
        local_344 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
        LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,local_344,LVar14);
        if ((bVar9) &&
           ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
            (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9)))) {
          Output::Print(L"BailOut:   Argument #%3u: value: 0x%p",(ulong)arg._4_4_,pvVar30);
        }
      }
      pvVar24 = Js::JavascriptOperators::BoxStackInstance(pvVar30,this,true,false);
      if ((pvVar24 != pvVar30) && (args->Values[arg._4_4_] = pvVar24, (DAT_01ec73ca & 1) != 0)) {
        local_348 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
        LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,local_348,LVar14);
        if ((bVar9) &&
           ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
            (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9)))) {
          Output::Print(L" (Boxed: 0x%p)");
        }
      }
      if ((DAT_01ec73ca & 1) != 0) {
        local_34c = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
        LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
        bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,local_34c,LVar14);
        if ((bVar9) &&
           ((bVar9 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8), bVar9 ||
            (bVar9 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind), bVar9)))) {
          Output::Print(L"\n");
        }
      }
    }
  }
  bVar9 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)pFVar18);
  if (bVar9) {
    if ((SUB84(args->Info,0) & 0xffffff) != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x600,"(args.Info.Count == 2)",
                         "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                        );
      if (!bVar9) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    pvVar30 = Js::Arguments::operator[](args,0);
    setup._56_8_ = Js::VarTo<Js::JavascriptGenerator>(pvVar30);
    allocation = (Var *)Js::JavascriptGenerator::GetFrame((JavascriptGenerator *)setup._56_8_);
    if ((InterpreterStackFrame *)allocation == (InterpreterStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x608,"(newInstance != nullptr)","newInstance != nullptr");
      if (!bVar9) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    Js::InterpreterStackFrame::ResetOut((InterpreterStackFrame *)allocation);
    *(bool **)((long)allocation + 0xb8) = &setup.bailedOut;
  }
  else {
    Js::InterpreterStackFrame::Setup::Setup
              ((Setup *)&varAllocCount,function_00,args,true,isInlinee,false);
    stackVarAllocCount =
         Js::InterpreterStackFrame::Setup::GetAllocationVarCount((Setup *)&varAllocCount);
    varSizeInBytes =
         Js::InterpreterStackFrame::Setup::GetStackAllocationVarCount((Setup *)&varAllocCount);
    tmpAlloc = (ArenaAllocator *)0x0;
    if (stackVarAllocCount + varSizeInBytes < 0x8001) {
      stackAllocation = (Var *)((stackVarAllocCount + varSizeInBytes) * 8);
      pTVar19 = Js::ScriptContext::GetThreadContext(this);
      ThreadContext::ProbeStack(pTVar19,(size_t)(stackAllocation + 0x800),this,returnAddress);
      pJVar32 = (JavascriptGenerator *)
                (auStack_3a8 + -((long)stackAllocation + 0xfU & 0xfffffffffffffff0));
      generator = pJVar32;
    }
    else {
      stackVarSizeInBytes = 0;
      Js::ScriptContext::EnsureInterpreterArena(this,(ArenaAllocator **)&stackVarSizeInBytes);
      stackAllocation = (Var *)(stackVarAllocCount << 3);
      generator = (JavascriptGenerator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)stackVarSizeInBytes,(size_t)stackAllocation);
      if (varSizeInBytes != 0) {
        lVar25 = varSizeInBytes * 8;
        pTVar19 = Js::ScriptContext::GetThreadContext(this);
        ThreadContext::ProbeStack(pTVar19,lVar25 + 0x4000,this,returnAddress);
        pJVar32 = (JavascriptGenerator *)(auStack_3a8 + -(lVar25 + 0xfU & 0xfffffffffffffff0));
        tmpAlloc = (ArenaAllocator *)pJVar32;
      }
    }
    frameStackAddr = 0;
    *(undefined8 *)&pJVar32[-1].bailInSymbolsTraceArrayCount = 0x505ce2;
    bVar9 = Js::FunctionBody::GetHasAllocatedLoopHeaders(pFVar18);
    if (bVar9) {
      *(undefined8 *)&pJVar32[-1].bailInSymbolsTraceArrayCount = 0x505cf1;
      frameStackAddr = (DWORD_PTR)Js::FunctionBody::GetLoopHeaderArrayPtr(pFVar18);
    }
    *(undefined8 *)&pJVar32[-1].bailInSymbolsTraceArrayCount = 0x505d01;
    pSVar26 = (ScriptFunction *)Js::JavascriptCallStackLayout::GetArgv(layout);
    __s = &pJVar32[-1].bailInSymbolsTraceArray;
    pJVar32[-1].resumeYieldObject.ptr = (DynamicObject *)0x505d2f;
    memset(__s,0xfe,0x10);
    stackAllocation_00 = tmpAlloc;
    pJVar32[-1].scriptFunction.ptr = pSVar26;
    pJVar32[-1].resumeYieldObject.ptr = (DynamicObject *)__s;
    pJVar32[-1].args.Values = (Type)0x505d71;
    allocation = (Var *)Js::InterpreterStackFrame::Setup::InitializeAllocation
                                  ((Setup *)&varAllocCount,(Var *)generator,
                                   (Var *)stackAllocation_00,false,false,
                                   (LoopHeader *)frameStackAddr,
                                   (DWORD_PTR)pJVar32[-1].scriptFunction.ptr,
                                   pJVar32[-1].resumeYieldObject.ptr);
    pJVar32[-1].resumeYieldObject.ptr = (DynamicObject *)0x505d8e;
    Js::ByteCodeReader::Create((ByteCodeReader *)allocation,pFVar18,0);
  }
  iVar15 = bailOutRecord->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
  if (iVar15 != -1) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505db6;
    pFVar27 = Js::JavascriptCallStackLayout::GetForInObjectEnumeratorArrayAtOffset(layout,iVar15);
    allocation[0xe] = pFVar27;
  }
  allocation[0x2a] = bailOutRecord->ehBailoutData;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505deb;
  Js::InterpreterStackFrame::OrFlags((InterpreterStackFrame *)allocation,8);
  if (bailOutKind == BailOutOnArrayAccessHelperCall) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e05;
    Js::InterpreterStackFrame::OrFlags((InterpreterStackFrame *)allocation,0x10);
  }
  else if (bailOutKind == BailOutOnNotNativeArray) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e1e;
    Js::InterpreterStackFrame::OrFlags((InterpreterStackFrame *)allocation,0x80);
  }
  if (isInlinee) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e37;
    Js::InterpreterStackFrame::OrFlags((InterpreterStackFrame *)allocation,0x40);
  }
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e43;
  this_02 = Js::InterpreterStackFrame::GetScriptContext((InterpreterStackFrame *)allocation);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e4b;
  pTVar19 = Js::ScriptContext::GetThreadContext(this_02);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e5a;
  bVar9 = BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind);
  if (!bVar9) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e6a;
    ThreadContext::ClearImplicitCallFlags(pTVar19);
  }
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e73;
  pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e7b;
  RVar16 = Js::FunctionBody::GetVarCount(pFVar20);
  if (RVar16 != 0) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e93;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505e9b;
    RVar17 = Js::FunctionBody::GetConstantCount(pFVar20);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505ecf;
    memset(allocation + (ulong)RVar17 + 0x2c,0,(ulong)RVar16 << 3);
  }
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505ed8;
  RVar16 = Js::FunctionBody::GetLocalFrameDisplayRegister(pFVar18);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505ee7;
  RVar17 = Js::FunctionBody::GetLocalClosureRegister(pFVar18);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505ef6;
  localRegisterID = Js::FunctionBody::GetParamClosureRegister(pFVar18);
  if (!isInlinee) {
    if (RVar16 != 0xffffffff) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505f18;
      AVar10 = Js::ParseableFunctionInfo::GetInParamsCount(&pFVar18->super_ParseableFunctionInfo);
      iVar15 = -5;
      if (AVar10 == 0) {
        iVar15 = -4;
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505f41;
      ppvVar28 = Js::JavascriptCallStackLayout::GetArgv(layout);
      pFVar29 = (FrameDisplay *)ppvVar28[(long)iVar15 + -2];
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505f66;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)allocation,pFVar29);
    }
    if (RVar17 != 0xffffffff) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505f78;
      AVar10 = Js::ParseableFunctionInfo::GetInParamsCount(&pFVar18->super_ParseableFunctionInfo);
      iVar15 = -6;
      if (AVar10 == 0) {
        iVar15 = -5;
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505fa1;
      ppvVar28 = Js::JavascriptCallStackLayout::GetArgv(layout);
      pvVar30 = ppvVar28[(long)iVar15 + -2];
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x505fc6;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)allocation,pvVar30);
    }
  }
  ((Type *)(__s + -8))->ptr = (WriteBarrierPtr<void> *)registerSaves;
  *(BailOutReturnValue **)(__s + -7) = bailOutReturnValue;
  ((Type *)(__s + -6))->ptr = (InterpreterStackFrame *)pArgumentsObject;
  __s[-5] = (Type)branchValue;
  ((Type *)(__s + -4))->Info = (Type)returnAddress;
  *(uint *)(__s + -3) = (uint)debugManager._7_1_;
  ((Type *)(__s + -2))->ptr = (ScriptFunction *)argoutRestoreAddress;
  ((Type *)(__s + -9))->ptr = (Type *)0x506030;
  RestoreValues(bailOutRecord,bailOutKind,layout,(InterpreterStackFrame *)allocation,this,false,
                &((Type *)(__s + -8))->ptr->ptr,
                (BailOutReturnValue *)*(anon_union_8_2_815e7e51_for_DynamicObject_2 *)(__s + -7),
                (Var *)((Type *)(__s + -6))->ptr,__s[-5].ptr,(void *)((Type *)(__s + -4))->Info,
                *(bool *)(__s + -3),((Type *)(__s + -2))->ptr);
  if (RVar16 != 0xffffffff) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50604f;
    pFVar29 = (FrameDisplay *)
              Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)allocation,RVar16);
    if (pFVar29 != (FrameDisplay *)0x0) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506073;
      Js::InterpreterStackFrame::SetLocalFrameDisplay((InterpreterStackFrame *)allocation,pFVar29);
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506089;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)allocation,RVar16,(Var)0x0);
    }
  }
  if (RVar17 != 0xffffffff) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5060a6;
    pvVar30 = Js::InterpreterStackFrame::GetNonVarReg((InterpreterStackFrame *)allocation,RVar17);
    if (pvVar30 != (Var)0x0) {
      bailOutRecord->globalBailOutRecordTable->field_0x2c =
           bailOutRecord->globalBailOutRecordTable->field_0x2c & 0xdf | 0x20;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5060dd;
      Js::InterpreterStackFrame::SetLocalClosure((InterpreterStackFrame *)allocation,pvVar30);
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5060f3;
      Js::InterpreterStackFrame::SetNonVarReg((InterpreterStackFrame *)allocation,RVar17,(Var)0x0);
    }
  }
  if (localRegisterID != 0xffffffff) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506110;
    pvVar30 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)allocation,localRegisterID);
    if (pvVar30 != (Var)0x0) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506134;
      Js::InterpreterStackFrame::SetParamClosure((InterpreterStackFrame *)allocation,pvVar30);
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50614a;
      Js::InterpreterStackFrame::SetNonVarReg
                ((InterpreterStackFrame *)allocation,localRegisterID,(Var)0x0);
    }
  }
  if (((byte)bailOutRecord->globalBailOutRecordTable->field_0x2c >> 4 & 1) != 0) {
    bVar1 = bailOutRecord->globalBailOutRecordTable->field_0x2c;
    bVar2 = bailOutRecord->globalBailOutRecordTable->field_0x2c;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506199;
    Js::InterpreterStackFrame::TrySetFrameObjectInHeapArgObj
              ((InterpreterStackFrame *)allocation,this,(bool)(bVar1 >> 3 & 1),
               (bool)(bVar2 >> 5 & 1));
  }
  bailOutRecord->globalBailOutRecordTable->field_0x2c =
       bailOutRecord->globalBailOutRecordTable->field_0x2c & 0xdf;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5061b5;
  uVar13 = Js::FunctionBody::GetInnerScopeCount(pFVar18);
  for (local_280 = 0; local_280 < uVar13; local_280 = local_280 + 1) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5061e0;
    RVar16 = Js::FunctionBody::GetFirstInnerScopeRegister(pFVar18);
    local_358 = (InterpreterStackFrame *)allocation;
    local_350 = local_280;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506218;
    pvVar30 = Js::InterpreterStackFrame::GetNonVarReg
                        ((InterpreterStackFrame *)allocation,RVar16 + local_280);
    uVar11 = local_350;
    pIVar7 = local_358;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50622d;
    Js::InterpreterStackFrame::SetInnerScopeFromIndex(pIVar7,uVar11,pvVar30);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506243;
    Js::InterpreterStackFrame::SetNonVarReg
              ((InterpreterStackFrame *)allocation,RVar16 + local_280,(Var)0x0);
  }
  local_368 = (InterpreterStackFrame *)allocation;
  local_359 = true;
  if (function._4_4_ == 0) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506280;
    BVar12 = IR::operator&(bailOutKind,BailOutForDebuggerBits);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506287;
    local_359 = IR::operator!(BVar12);
  }
  bVar9 = local_359;
  pIVar7 = local_368;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5062a5;
  Js::InterpreterStackFrame::SetClosureInitDone(pIVar7,bVar9);
  pSVar26 = *functionRef;
  if (function_00 != pSVar26) {
    auStack_3a8._56_8_ = pSVar26;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5062dd;
    pSVar31 = (ScriptFunction *)
              Js::StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)function_00);
    if ((ScriptFunction *)auStack_3a8._56_8_ != pSVar31) {
      AssertCount = AssertCount + 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506306;
      Js::Throw::LogAssert();
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506316;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50633b;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x6e6,
                         "(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function))"
                         ,
                         "currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function)"
                        );
      if (!bVar9) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506351;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50636c;
    Js::InterpreterStackFrame::SetExecutingStackFunction
              ((InterpreterStackFrame *)allocation,pSVar26);
  }
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506379;
  UpdatePolymorphicFieldAccess((JavascriptFunction *)function_00,bailOutRecord);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506382;
  auStack_3a8._52_4_ = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506391;
  LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
  uVar5 = auStack_3a8._52_4_;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5063b1;
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,uVar5,LVar14);
  if (bVar9) {
LAB_005063f3:
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5063f8;
    Output::Flush();
  }
  else {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5063be;
    auStack_3a8._48_4_ = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5063cd;
    LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
    uVar5 = auStack_3a8._48_4_;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5063ed;
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar14);
    if (bVar9) goto LAB_005063f3;
  }
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506401;
  Js::FunctionBody::BeginExecution(pFVar18);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506410;
  Js::ByteCodeReader::SetCurrentOffset((ByteCodeReader *)allocation,function._4_4_);
  pushPopFrameHelper.m_isHiddenFrame = false;
  pushPopFrameHelper._17_7_ = 0;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506436;
  Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_2b0,(InterpreterStackFrame *)allocation,returnAddress,
             &stack0x00000000);
  if (bVar8) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506448;
    auStack_3a8._32_8_ =
         Js::InterpreterStackFrame::DebugProcess((InterpreterStackFrame *)allocation);
    auStack_3a8._40_8_ = auStack_3a8._32_8_;
  }
  else {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50646d;
    auStack_3a8._24_8_ = Js::InterpreterStackFrame::Process((InterpreterStackFrame *)allocation);
    auStack_3a8._32_8_ = auStack_3a8._24_8_;
  }
  pushPopFrameHelper._16_8_ = auStack_3a8._32_8_;
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064a0;
  Js::InterpreterStackFrame::PushPopFrameHelper::~PushPopFrameHelper
            ((PushPopFrameHelper *)local_2b0);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064a9;
  Js::FunctionBody::EndExecution(pFVar18);
  ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064b2;
  bVar8 = Js::FunctionBody::HasDynamicProfileInfo(pFVar18);
  if (bVar8) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064c1;
    auStack_3a8._16_8_ = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar18);
    oldValue = (Var)auStack_3a8._16_8_;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064e2;
    flags = ThreadContext::GetImplicitCallFlags(pTVar19);
    uVar6 = auStack_3a8._16_8_;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5064f1;
    Js::DynamicProfileInfo::RecordImplicitCallFlags((DynamicProfileInfo *)uVar6,flags);
  }
  if ((DAT_01ec73ca & 1) != 0) {
    pJVar3 = (JavascriptFunction *)allocation[0x10];
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50653d;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506545;
    auStack_3a8._12_4_ = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar20);
    pJVar3 = (JavascriptFunction *)allocation[0x10];
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50655e;
    pFVar20 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506566;
    LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar20);
    uVar5 = auStack_3a8._12_4_;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506586;
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar14);
    if (bVar8) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50659f;
      bVar8 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8);
      if (!bVar8) {
        ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5065b9;
        bVar8 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind);
        if (!bVar8) goto LAB_005065d6;
      }
      uVar6 = pushPopFrameHelper._16_8_;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5065d4;
      Output::Print(L"BailOut:   Return Value: 0x%p",uVar6);
    }
  }
LAB_005065d6:
  if (((byte)bailOutRecord->globalBailOutRecordTable->field_0x2c >> 1 & 1) != 0) {
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5065f7;
    bVar8 = Js::FunctionProxy::IsGenerator((FunctionProxy *)pFVar18);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506617;
      Js::Throw::LogAssert();
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506627;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50664c;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70c,"(!executeFunction->IsGenerator())",
                         "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object"
                        );
      if (!bVar8) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506662;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    if (((ulong)args->Info & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506698;
      Js::Throw::LogAssert();
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5066a8;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 1;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5066cd;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70d,"(args.Info.Count != 0)","args.Info.Count != 0");
      if (!bVar8) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5066e3;
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar21 = 0;
    }
    uVar6 = pushPopFrameHelper._16_8_;
    pvVar30 = *args->Values;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506708;
    pvVar30 = Js::JavascriptFunction::FinishConstructor
                        ((Var)uVar6,pvVar30,(JavascriptFunction *)function_00,false);
    local_2d0 = pvVar30;
    pushPopFrameHelper._16_8_ = pvVar30;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506734;
    pushPopFrameHelper._16_8_ = Js::JavascriptOperators::BoxStackInstance(pvVar30,this,true,false);
    if ((local_2d0 != (Var)pushPopFrameHelper._16_8_) && ((DAT_01ec73ca & 1) != 0)) {
      pJVar3 = (JavascriptFunction *)allocation[0x10];
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506776;
      pFVar18 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50677e;
      auStack_3a8._8_4_ = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
      pJVar3 = (JavascriptFunction *)allocation[0x10];
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506797;
      pFVar18 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50679f;
      LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
      uVar5 = auStack_3a8._8_4_;
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5067bf;
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar14);
      if (bVar8) {
        ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5067d8;
        bVar8 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8);
        if (!bVar8) {
          ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5067f2;
          bVar8 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind);
          if (!bVar8) goto LAB_00506813;
        }
        uVar6 = pushPopFrameHelper._16_8_;
        ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50680d;
        Output::Print(L" (Boxed: 0x%p)",uVar6);
      }
    }
  }
LAB_00506813:
  if ((DAT_01ec73ca & 1) != 0) {
    pJVar3 = (JavascriptFunction *)allocation[0x10];
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50683a;
    pFVar18 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506842;
    auStack_3a8._4_4_ = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar18);
    pJVar3 = (JavascriptFunction *)allocation[0x10];
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50685b;
    pFVar18 = Js::JavascriptFunction::GetFunctionBody(pJVar3);
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506863;
    LVar14 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
    uVar5 = auStack_3a8._4_4_;
    ((Type *)(__s + -1))->ptr = (DynamicObject *)0x506883;
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar5,LVar14);
    if (bVar8) {
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x50689c;
      bVar8 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca2c8);
      if (!bVar8) {
        ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5068b6;
        bVar8 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca2c8,bailOutKind);
        if (!bVar8) {
          return (Var)pushPopFrameHelper._16_8_;
        }
      }
      ((Type *)(__s + -1))->ptr = (DynamicObject *)0x5068ca;
      Output::Print(L"\n");
    }
  }
  return (Var)pushPopFrameHelper._16_8_;
}

Assistant:

Js::Var
BailOutRecord::BailOutHelper(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction ** functionRef, Js::Arguments& args, const bool isInlinee,
    BailOutRecord const * bailOutRecord, uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * argoutRestoreAddress)
{
    Js::ScriptFunction * function = *functionRef;
    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Whether to enter StartCall while doing RestoreValues. We don't do that when bailout due to ignore exception under debugger.
    bool useStartCall = true;

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
    bool isInDebugMode = executeFunction->IsInDebugMode();

    // Adjust bailout offset for debug mode (only scenario when we ignore exception).
    if (isInDebugMode)
    {
        Js::DebugManager* debugManager = functionScriptContext->GetThreadContext()->GetDebugManager();
        DebuggingFlags* debuggingFlags = debugManager->GetDebuggingFlags();
        int byteCodeOffsetAfterEx = debuggingFlags->GetByteCodeOffsetAfterIgnoreException();

        // Note that in case where bailout for ignore exception immediately follows regular bailout after a helper,
        // and ignore exception happens, we would bail out with non-exception kind with exception data recorded.
        // In this case we need to treat the bailout as ignore exception one and continue to next/set stmt.
        // This is fine because we only set byteCodeOffsetAfterEx for helpers (HelperMethodWrapper, when enabled)
        // and ignore exception is needed for all helpers.
        if ((bailOutKind & IR::BailOutIgnoreException) || byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
        {
            bool needResetData = true;

            // Note: the func # in debuggingFlags still can be 0 in case actual b/o reason was not BailOutIgnoreException,
            //       but BailOutIgnoreException was on the OR'ed values for b/o check.
            bool isSameFunction = debuggingFlags->GetFuncNumberAfterIgnoreException() == DebuggingFlags::InvalidFuncNumber ||
                debuggingFlags->GetFuncNumberAfterIgnoreException() == function->GetFunctionBody()->GetFunctionNumber();
            AssertMsg(isSameFunction, "Bailout due to ignore exception in different function, can't bail out cross functions!");

            if (isSameFunction)
            {
                Assert(!(byteCodeOffsetAfterEx == DebuggingFlags::InvalidByteCodeOffset && debuggingFlags->GetFuncNumberAfterIgnoreException() != DebuggingFlags::InvalidFuncNumber));

                if (byteCodeOffsetAfterEx != DebuggingFlags::InvalidByteCodeOffset)
                {
                    // We got an exception in native frame, and need to bail out to interpreter
                    if (debugManager->stepController.IsActive())
                    {
                        // Native frame went away, and there will be interpreter frame on its place.
                        // Make sure that frameAddrWhenSet it less than current interpreter frame -- we use it to detect stack depth.
                        debugManager->stepController.SetFrameAddr(0);
                    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (bailOutOffset != (uint)byteCodeOffsetAfterEx || !(bailOutKind & IR::BailOutIgnoreException))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function: %s (%s) offset: #%04x -> #%04x Opcode: %s Treating as: %S"), executeFunction->GetDisplayName(),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, byteCodeOffsetAfterEx, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                        BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: changing due to ignore exception: function %s, Opcode: %s, Treating as: %S"), executeFunction->GetDisplayName(),
                            Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode), ::GetBailOutKindName(IR::BailOutIgnoreException));
                    }
#endif

                    // Set the byte code offset to continue from next user statement.
                    bailOutOffset = byteCodeOffsetAfterEx;

                    // Reset current call count so that we don't do StartCall for inner calls. See WinBlue 272569.
                    // The idea is that next statement can never be set to the inner StartCall (another call as part of an ArgOut),
                    // it will be next statement in the function.
                    useStartCall = false;
                }
                else
                {
                    needResetData = false;
                }
            }

            if (needResetData)
            {
                // Reset/correct the flag as either we processed it or we need to correct wrong flag.
                debuggingFlags->ResetByteCodeOffsetAndFuncAfterIgnoreException();
            }
        }
    }
#endif

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) offset: #%04x Opcode: %s"), executeFunction->GetDisplayName(),
        executeFunction->GetDebugNumberSet(debugStringBuffer), bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));
    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Opcode: %s"), executeFunction->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    if (isInlinee && args.Info.Count != 0)
    {
        // Box arguments. Inlinee arguments may be allocated on the stack.
        for(uint i = 0; i < args.Info.Count; ++i)
        {
            const Js::Var arg = args.Values[i];
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("BailOut:   Argument #%3u: value: 0x%p"), i, arg);
            const Js::Var boxedArg = Js::JavascriptOperators::BoxStackInstance(arg, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
            if(boxedArg != arg)
            {
                args.Values[i] = boxedArg;
                BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u(" (Boxed: 0x%p)"), boxedArg);
            }
            BAILOUT_VERBOSE_TRACE(executeFunction, bailOutKind, _u("\n"));
        }
    }

    bool fReleaseAlloc = false;
    Js::InterpreterStackFrame* newInstance = nullptr;
    Js::Var* allocation = nullptr;

    if (executeFunction->IsCoroutine())
    {
        // If the FunctionBody is a generator then this call is being made by one of the three
        // generator resuming methods: next(), throw(), or return(). They all pass the generator
        // object as the first of two arguments. The real user arguments are obtained from the
        // generator object. The second argument is the resume yield object which is only needed
        // when resuming a generator and not needed when yielding from a generator, as is occurring here.
        AssertMsg(args.Info.Count == 2, "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");
        Js::JavascriptGenerator* generator = Js::VarTo<Js::JavascriptGenerator>(args[0]);
        newInstance = generator->GetFrame();

        // The jit relies on the interpreter stack frame to store various information such as
        // for-in enumerators. Therefore, we always create an interpreter stack frame for generator
        // as part of the resume jump table, at the beginning of the jit'd function, if it doesn't
        // already exist.
        Assert(newInstance != nullptr);

        // BailOut will recompute OutArg pointers based on BailOutRecord. Reset them back
        // to initial position before that happens so that OP_StartCall calls don't accumulate
        // incorrectly over multiple yield bailouts.
        newInstance->ResetOut();

        // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
        // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
        newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);
    }
    else
    {
        Js::InterpreterStackFrame::Setup setup(function, args, true /* bailedOut */, isInlinee);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
        size_t varSizeInBytes;
        Js::Var *stackAllocation = nullptr;

        // If the locals area exceeds a certain limit, allocate it from a private arena rather than
        // this frame. The current limit is based on an old assert on the number of locals we would allow here.
        if ((varAllocCount + stackVarAllocCount) > Js::InterpreterStackFrame::LocalsThreshold)
        {
            ArenaAllocator *tmpAlloc = nullptr;
            fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
            varSizeInBytes = varAllocCount * sizeof(Js::Var);
            allocation = (Js::Var*)tmpAlloc->Alloc(varSizeInBytes);
            if (stackVarAllocCount != 0)
            {
                size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Js::Var);
                PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes, returnAddress);
                stackAllocation = (Js::Var*)_alloca(stackVarSizeInBytes);
            }
        }
        else
        {
            varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Js::Var);
            PROBE_STACK_PARTIAL_INITIALIZED_BAILOUT_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes, returnAddress);
            allocation = (Js::Var*)_alloca(varSizeInBytes);
        }

        Js::LoopHeader* loopHeaderArray = nullptr;

        if (executeFunction->GetHasAllocatedLoopHeaders())
        {
            // Loop header array is recycler allocated, so we push it on the stack
            // When we scan the stack, we'll recognize it as a recycler allocated
            // object, and mark it's contents and keep the individual loop header
            // wrappers alive
            loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
        }

        // Set stack address for STEP_OUT/recursion detection for new frame.
        // This frame is originally jitted frame for which we create a new interpreter frame on top of it on stack,
        // set the stack address to some stack location that belong to the original jitted frame.
        DWORD_PTR frameStackAddr = reinterpret_cast<DWORD_PTR>(layout->GetArgv());

        // Initialize the interpreter stack frame (constants) but not the param, the bailout record will restore the value
#if DBG
        Js::Var invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
        memset(invalidStackVar, 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, stackAllocation, false, false, loopHeaderArray, frameStackAddr
#if DBG
            , invalidStackVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);
    }

    int forInEnumeratorArrayRestoreOffset = bailOutRecord->globalBailOutRecordTable->forInEnumeratorArrayRestoreOffset;
    if (forInEnumeratorArrayRestoreOffset != -1)
    {
        newInstance->forInObjectEnumerators = layout->GetForInObjectEnumeratorArrayAtOffset(forInEnumeratorArrayRestoreOffset);
    }

    newInstance->ehBailoutData = bailOutRecord->ehBailoutData;
    newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOut);
    if (bailOutKind == IR::BailOutOnArrayAccessHelperCall)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall);
    }
    else if (bailOutKind == IR::BailOutOnNotNativeArray)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);
    }

    if (isInlinee)
    {
        newInstance->OrFlags(Js::InterpreterStackFrameFlags_FromBailOutInInlinee);
    }

    ThreadContext *threadContext = newInstance->GetScriptContext()->GetThreadContext();

    // If this is a bailout on implicit calls, then it must have occurred at the current statement.
    // Otherwise, assume that the bits are stale, so clear them before entering the interpreter.
    if (!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        threadContext->ClearImplicitCallFlags();
    }

    Js::RegSlot varCount = function->GetFunctionBody()->GetVarCount();
    if (varCount)
    {
        Js::RegSlot constantCount = function->GetFunctionBody()->GetConstantCount();
        memset(newInstance->m_localSlots + constantCount, 0, varCount * sizeof(Js::Var));
    }

    Js::RegSlot localFrameDisplayReg = executeFunction->GetLocalFrameDisplayRegister();
    Js::RegSlot localClosureReg = executeFunction->GetLocalClosureRegister();
    Js::RegSlot paramClosureReg = executeFunction->GetParamClosureRegister();

    if (!isInlinee)
    {
        // If byte code was generated to do stack closures, restore closure pointers before the normal RestoreValues.
        // If code was jitted for stack closures, we have to restore the pointers from known stack locations.
        // (RestoreValues won't do it.) If stack closures were disabled for this function before we jitted,
        // then the values on the stack are garbage, but if we need them then RestoreValues will overwrite with
        // the correct values.
        if (localFrameDisplayReg != Js::Constants::NoRegister)
        {
            Js::FrameDisplay *localFrameDisplay;
            uintptr_t frameDisplayIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackFrameDisplay) - 2;

            localFrameDisplay = (Js::FrameDisplay*)layout->GetArgv()[frameDisplayIndex];
            newInstance->SetLocalFrameDisplay(localFrameDisplay);
        }

        if (localClosureReg != Js::Constants::NoRegister)
        {
            Js::Var localClosure;
            uintptr_t scopeSlotsIndex = (uintptr_t)(
#if _M_IX86 || _M_AMD64
                executeFunction->GetInParamsCount() == 0 ?
                Js::JavascriptFunctionArgIndex_StackScopeSlotsNoArg :
#endif
                Js::JavascriptFunctionArgIndex_StackScopeSlots) - 2;

            localClosure = layout->GetArgv()[scopeSlotsIndex];
            newInstance->SetLocalClosure(localClosure);
        }
    }

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, newInstance, functionScriptContext, false, registerSaves, bailOutReturnValue, pArgumentsObject, branchValue, returnAddress, useStartCall, argoutRestoreAddress);

    // For functions that don't get the scope slot and frame display pointers back from the known stack locations
    // (see above), get them back from the designated registers.
    // In either case, clear the values from those registers, because the interpreter should not be able to access
    // those values through the registers (only through its private fields).

    if (localFrameDisplayReg != Js::Constants::NoRegister)
    {
        Js::FrameDisplay *frameDisplay = (Js::FrameDisplay*)newInstance->GetNonVarReg(localFrameDisplayReg);
        if (frameDisplay)
        {
            newInstance->SetLocalFrameDisplay(frameDisplay);
            newInstance->SetNonVarReg(localFrameDisplayReg, nullptr);
        }
    }

    if (localClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(localClosureReg);
        if (closure)
        {
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = true;
            newInstance->SetLocalClosure(closure);
            newInstance->SetNonVarReg(localClosureReg, nullptr);
        }
    }

    if (paramClosureReg != Js::Constants::NoRegister)
    {
        Js::Var closure = newInstance->GetNonVarReg(paramClosureReg);
        if (closure)
        {
            newInstance->SetParamClosure(closure);
            newInstance->SetNonVarReg(paramClosureReg, nullptr);
        }
    }

    if (bailOutRecord->globalBailOutRecordTable->hasStackArgOpt)
    {
        newInstance->TrySetFrameObjectInHeapArgObj(functionScriptContext, bailOutRecord->globalBailOutRecordTable->hasNonSimpleParams,
            bailOutRecord->globalBailOutRecordTable->isScopeObjRestored);
    }

    //Reset the value for tracking the restoration during next bail out.
    bailOutRecord->globalBailOutRecordTable->isScopeObjRestored = false;

    uint32 innerScopeCount = executeFunction->GetInnerScopeCount();
    for (uint32 i = 0; i < innerScopeCount; i++)
    {
        Js::RegSlot reg = executeFunction->GetFirstInnerScopeRegister() + i;
        newInstance->SetInnerScopeFromIndex(i, newInstance->GetNonVarReg(reg));
        newInstance->SetNonVarReg(reg, nullptr);
    }

    newInstance->SetClosureInitDone(bailOutOffset != 0 || !(bailOutKind & IR::BailOutForDebuggerBits));

    // RestoreValues may call EnsureArguments and cause functions to be boxed.
    // Since the interpreter frame that hasn't started yet, StackScriptFunction::Box would not have replaced the function object
    // in the restoring interpreter frame. Let's make sure the current interpreter frame has the unboxed version.
    // Note: Only use the unboxed version if we have replaced the function argument on the stack via boxing
    // so that the interpreter frame we are bailing out to matches the one in the function argument list
    // (which is used by the stack walker to match up stack frame and the interpreter frame).
    // Some function are boxed but we continue to use the stack version to call the function - those that only live in register
    // and are not captured in frame displays.
    // Those uses are fine, but that means the function argument list will have the stack function object that is passed it and
    // not be replaced with a just boxed one.

    Js::ScriptFunction * currentFunctionObject = *functionRef;
    if (function != currentFunctionObject)
    {
        Assert(currentFunctionObject == Js::StackScriptFunction::GetCurrentFunctionObject(function));
        newInstance->SetExecutingStackFunction(currentFunctionObject);
    }

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    BAILOUT_FLUSH(executeFunction);

    executeFunction->BeginExecution();

    // Restart at the bailout byte code offset.
    newInstance->m_reader.SetCurrentOffset(bailOutOffset);

    Js::Var aReturn = nullptr;

    {
        // Following _AddressOfReturnAddress <= real address of "returnAddress". Suffices for RemoteStackWalker to test partially initialized interpreter frame.
        Js::InterpreterStackFrame::PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, _AddressOfReturnAddress());
#ifdef ENABLE_SCRIPT_DEBUGGING
        aReturn = isInDebugMode ? newInstance->DebugProcess() : newInstance->Process();
#else
        aReturn = newInstance->Process();
#endif
        // Note: in debug mode we always have to bailout to debug thunk,
        //       as normal interpreter thunk expects byte code compiled w/o debugging.
    }

    executeFunction->EndExecution();

    if (executeFunction->HasDynamicProfileInfo())
    {
        Js::DynamicProfileInfo *dynamicProfileInfo = executeFunction->GetAnyDynamicProfileInfo();
        dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
    }

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Return Value: 0x%p"), aReturn);
    if (bailOutRecord->globalBailOutRecordTable->isInlinedConstructor)
    {
        AssertMsg(!executeFunction->IsGenerator(), "Generator functions are not expected to be inlined. If this changes then need to use the real user args here from the generator object");
        Assert(args.Info.Count != 0);
        aReturn = Js::JavascriptFunction::FinishConstructor(aReturn, args.Values[0], function);

        Js::Var oldValue = aReturn;
        aReturn = Js::JavascriptOperators::BoxStackInstance(oldValue, functionScriptContext, /* allowStackFunction */ true, /* deepCopy */ false);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (oldValue != aReturn)
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), aReturn);
        }
#endif
    }
    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
    return aReturn;
}